

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::~IfcOrientedEdge(IfcOrientedEdge *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcEdge.field_0x50 = 0x850e38;
  (this->super_IfcEdge).EdgeEnd.obj = (LazyObject *)(vtable + 0xb8);
  this[-1].Orientation._M_string_length = 0x850e60;
  *(undefined8 *)((long)&this[-1].Orientation.field_2 + 8) = 0x850e88;
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x850eb0;
  puVar1 = *(undefined1 **)
            &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  puVar2 = &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.field_0x28;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}